

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_two_connections.cpp
# Opt level: O0

void __thiscall
TwoConnections_SyncOnSecondConnectionUpdatesFooterPos_Test::TestBody
          (TwoConnections_SyncOnSecondConnectionUpdatesFooterPos_Test *this)

{
  bool bVar1;
  char *pcVar2;
  database *pdVar3;
  AssertHelper local_130;
  Message local_128;
  typed_address<pstore::trailer> local_120;
  value_type local_118;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_3;
  Message local_f8;
  typed_address<pstore::trailer> local_f0;
  typed_address<pstore::trailer> local_e8;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_2;
  Message local_c8;
  typed_address<pstore::trailer> local_c0;
  value_type local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_1;
  Message local_98;
  typed_address<pstore::trailer> local_90;
  typed_address<pstore::trailer> local_88;
  undefined1 local_80 [8];
  AssertionResult gtest_ar;
  undefined1 local_60 [8];
  transaction<pstore::lock_guard<pstore::transaction_mutex>_> transaction;
  TwoConnections_SyncOnSecondConnectionUpdatesFooterPos_Test *this_local;
  
  transaction.lock_._32_8_ = this;
  pstore::begin((transaction<pstore::lock_guard<pstore::transaction_mutex>_> *)local_60,
                &(this->super_TwoConnections).first);
  anon_unknown.dwarf_2bcd1c::append_int((transaction_base *)local_60,1);
  pstore::transaction_base::commit((transaction_base *)local_60);
  pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>_>::~transaction
            ((transaction<pstore::lock_guard<pstore::transaction_mutex>_> *)local_60);
  pdVar3 = &(this->super_TwoConnections).second;
  pstore::database::sync(pdVar3);
  local_88 = pstore::database::footer_pos(&(this->super_TwoConnections).first);
  local_90 = pstore::database::footer_pos(pdVar3);
  testing::internal::EqHelper::
  Compare<pstore::typed_address<pstore::trailer>,_pstore::typed_address<pstore::trailer>,_nullptr>
            ((EqHelper *)local_80,"first.footer_pos ()","second.footer_pos ()",&local_88,&local_90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_two_connections.cpp"
               ,0x5f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  pdVar3 = &(this->super_TwoConnections).second;
  pstore::database::sync(pdVar3);
  local_c0 = pstore::database::footer_pos(pdVar3);
  local_b8 = pstore::typed_address<pstore::trailer>::absolute(&local_c0);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_b0,"pstore::leader_size","second.footer_pos ().absolute ()",
             &pstore::leader_size,&local_b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_two_connections.cpp"
               ,0x61,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  pdVar3 = &(this->super_TwoConnections).second;
  pstore::database::sync(pdVar3);
  local_e8 = pstore::database::footer_pos(&(this->super_TwoConnections).first);
  local_f0 = pstore::database::footer_pos(pdVar3);
  testing::internal::EqHelper::
  Compare<pstore::typed_address<pstore::trailer>,_pstore::typed_address<pstore::trailer>,_nullptr>
            ((EqHelper *)local_e0,"first.footer_pos ()","second.footer_pos ()",&local_e8,&local_f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_two_connections.cpp"
               ,99,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  pdVar3 = &(this->super_TwoConnections).second;
  pstore::database::sync(pdVar3);
  local_120 = pstore::database::footer_pos(pdVar3);
  local_118 = pstore::typed_address<pstore::trailer>::absolute(&local_120);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_110,"pstore::leader_size","second.footer_pos ().absolute ()",
             &pstore::leader_size,&local_118);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_two_connections.cpp"
               ,0x65,pcVar2);
    testing::internal::AssertHelper::operator=(&local_130,&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  return;
}

Assistant:

TEST_F (TwoConnections, SyncOnSecondConnectionUpdatesFooterPos) {
    {
        auto transaction = pstore::begin (first);
        append_int (transaction, 1);
        transaction.commit ();
    }
    second.sync ();
    EXPECT_EQ (first.footer_pos (), second.footer_pos ());
    second.sync (0U);
    EXPECT_EQ (pstore::leader_size, second.footer_pos ().absolute ());
    second.sync (1U);
    EXPECT_EQ (first.footer_pos (), second.footer_pos ());
    second.sync (0U);
    EXPECT_EQ (pstore::leader_size, second.footer_pos ().absolute ());
}